

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * luaH_getint(Table *t,lua_Integer key)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  Node *pNVar4;
  uint uVar5;
  
  uVar1 = key - 1;
  uVar3 = t->alimit;
  if (uVar3 <= uVar1) {
    if (((-1 < (char)t->flags) ||
        (uVar5 = uVar3 - (uVar3 >> 1 & 0x55555555),
        uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333),
        ((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) ||
       (((ulong)(uVar3 + 1) != key && (uVar3 = luaH_realasize(t), uVar3 <= uVar1)))) {
      pNVar4 = hashint(t,key);
      while (((pNVar4->u).key_tt != '\x03' || ((pNVar4->u).key_val.gc != (GCObject *)key))) {
        piVar2 = &(pNVar4->u).next;
        pNVar4 = pNVar4 + *piVar2;
        if ((long)*piVar2 == 0) {
          return &absentkey;
        }
      }
      return (TValue *)pNVar4;
    }
    t->alimit = (uint)key;
  }
  return t->array + uVar1;
}

Assistant:

const TValue *luaH_getint (Table *t, lua_Integer key) {
  if (l_castS2U(key) - 1u < t->alimit)  /* 'key' in [1, t->alimit]? */
    return &t->array[key - 1];
  else if (!limitequalsasize(t) &&  /* key still may be in the array part? */
           (l_castS2U(key) == t->alimit + 1 ||
            l_castS2U(key) - 1u < luaH_realasize(t))) {
    t->alimit = cast_uint(key);  /* probably '#t' is here now */
    return &t->array[key - 1];
  }
  else {
    Node *n = hashint(t, key);
    for (;;) {  /* check whether 'key' is somewhere in the chain */
      if (keyisinteger(n) && keyival(n) == key)
        return gval(n);  /* that's it */
      else {
        int nx = gnext(n);
        if (nx == 0) break;
        n += nx;
      }
    }
    return &absentkey;
  }
}